

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                 (RepeatedField<int> *value,size_t tag_size,CachedSize *cached_size)

{
  long lVar1;
  int iVar2;
  int *data;
  size_t sVar3;
  ulong uVar4;
  
  iVar2 = SooRep::size(&value->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
  if (iVar2 == 0) {
    if (cached_size->atom_ != 0) {
      cached_size->atom_ = 0;
    }
    sVar3 = 0;
  }
  else {
    if ((undefined1  [16])((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      data = &(value->soo_rep_).field_0.long_rep.size;
    }
    else {
      data = (int *)LongSooRep::elements((LongSooRep *)value);
    }
    iVar2 = SooRep::size(&value->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(value->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
    sVar3 = VarintSize<true,false,int>(data,iVar2);
    CachedSize::SetNonZero(cached_size,(int)sVar3);
    uVar4 = (long)(int)sVar3 | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + tag_size + sVar3;
  }
  return sVar3;
}

Assistant:

size_t WireFormatLite::SInt32SizeWithPackedTagSize(
    const RepeatedField<int32_t>& value, size_t tag_size,
    const internal::CachedSize& cached_size) {
  if (value.empty()) {
    cached_size.Set(0);
    return 0;
  }
  size_t res;
  PROTOBUF_ALWAYS_INLINE_CALL res = SInt32Size(value);
  cached_size.SetNonZero(ToCachedSize(res));
  return tag_size + res + Int32Size(static_cast<int32_t>(res));
}